

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O1

void __thiscall
diy::AMRLink::Description::Description
          (Description *this,int level_,Point *refinement_,Bounds *core_,Bounds *bounds_)

{
  allocator<int> local_25;
  allocator<int> local_24;
  allocator<int> local_23;
  allocator<int> local_22;
  allocator<int> local_21;
  
  this->level = level_;
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&(this->refinement).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,
             &refinement_->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,&local_25);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&this->core,
             (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)core_,&local_24);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&(this->core).max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,
             &(core_->max).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,&local_23);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&this->bounds,
             (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)bounds_,&local_22);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&(this->bounds).max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,
             &(bounds_->max).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,&local_21);
  return;
}

Assistant:

Description(int level_, Point refinement_, Bounds core_, Bounds bounds_):
                        level(level_), refinement(refinement_), core(core_), bounds(bounds_)    {}